

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O2

void Rnm_ManCollect_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vObjs,int nAddOn)

{
  int *piVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = Gia_ObjId(p,pObj);
  if (p->nTravIdsAlloc <= iVar2) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x229,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  piVar1 = p->pTravIds;
  iVar2 = Gia_ObjId(p,pObj);
  if (piVar1[iVar2] == p->nTravIds) {
    return;
  }
  Gia_ObjSetTravIdCurrent(p,pObj);
  iVar2 = (int)*(ulong *)pObj;
  uVar3 = *(ulong *)pObj & 0x1fffffff;
  if (-1 < iVar2 || uVar3 == 0x1fffffff) {
    if (iVar2 < 0 || (int)uVar3 == 0x1fffffff) {
      iVar2 = Gia_ObjIsRo(p,pObj);
      if (iVar2 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absRef.c"
                      ,0x15b,"void Rnm_ManCollect_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, int)");
      }
      goto LAB_00492244;
    }
    Rnm_ManCollect_rec(p,pObj + -uVar3,vObjs,nAddOn);
    uVar3 = (ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
  }
  Rnm_ManCollect_rec(p,pObj + -uVar3,vObjs,nAddOn);
LAB_00492244:
  pObj->Value = nAddOn + vObjs->nSize;
  iVar2 = Gia_ObjId(p,pObj);
  Vec_IntPush(vObjs,iVar2);
  return;
}

Assistant:

void Rnm_ManCollect_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vObjs, int nAddOn )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCo(pObj) )
        Rnm_ManCollect_rec( p, Gia_ObjFanin0(pObj), vObjs, nAddOn );
    else if ( Gia_ObjIsAnd(pObj) )
    {
        Rnm_ManCollect_rec( p, Gia_ObjFanin0(pObj), vObjs, nAddOn );
        Rnm_ManCollect_rec( p, Gia_ObjFanin1(pObj), vObjs, nAddOn );
    }
    else if ( !Gia_ObjIsRo(p, pObj) )
        assert( 0 );
    pObj->Value = Vec_IntSize(vObjs) + nAddOn;
    Vec_IntPush( vObjs, Gia_ObjId(p, pObj) );
}